

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen_status yajl_gen_array_close(yajl_gen g)

{
  uint uVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  uint *in_RDI;
  uint _i;
  uint local_14;
  yajl_gen_status local_4;
  
  if (in_RDI[(ulong)in_RDI[1] + 4] == 7) {
    local_4 = yajl_gen_in_error_state;
  }
  else if (in_RDI[(ulong)in_RDI[1] + 4] == 6) {
    local_4 = yajl_gen_generation_complete;
  }
  else {
    uVar1 = in_RDI[1];
    in_RDI[1] = uVar1 - 1;
    if (uVar1 - 1 < 0x80) {
      if ((*in_RDI & 1) != 0) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
      switch(in_RDI[(ulong)in_RDI[1] + 4]) {
      case 0:
        in_RDI[(ulong)in_RDI[1] + 4] = 6;
        break;
      case 1:
      case 2:
        in_RDI[(ulong)in_RDI[1] + 4] = 3;
        break;
      case 3:
        in_RDI[(ulong)in_RDI[1] + 4] = 2;
        break;
      case 4:
        in_RDI[(ulong)in_RDI[1] + 4] = 5;
      }
      if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] != 3)) {
        for (local_14 = 0; local_14 < in_RDI[1]; local_14 = local_14 + 1) {
          pcVar2 = *(code **)(in_RDI + 0x84);
          uVar3 = *(undefined8 *)(in_RDI + 0x86);
          uVar4 = *(undefined8 *)(in_RDI + 2);
          sVar5 = strlen(*(char **)(in_RDI + 2));
          (*pcVar2)(uVar3,uVar4,sVar5 & 0xffffffff);
        }
      }
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"]",1);
      if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] == 6)) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
      local_4 = yajl_gen_status_ok;
    }
    else {
      local_4 = yajl_gen_generation_complete;
    }
  }
  return local_4;
}

Assistant:

yajl_gen_status
yajl_gen_array_close(yajl_gen g)
{
    ENSURE_VALID_STATE;
    DECREMENT_DEPTH;
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    APPENDED_ATOM;
    INSERT_WHITESPACE;
    g->print(g->ctx, "]", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}